

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O1

int archive_compressor_zstd_flush(archive_write_filter *f)

{
  private_data_conflict9 *data;
  int iVar1;
  
  data = (private_data_conflict9 *)f->data;
  if ((((data->frame_per_file != 0) && (data->state == running)) &&
      (data->min_frame_in < data->cur_frame_in)) && (data->min_frame_out < data->cur_frame_out)) {
    data->state = finishing;
  }
  iVar1 = drive_compressor(f,data,1,(void *)0x0,0);
  return iVar1;
}

Assistant:

static int
archive_compressor_zstd_flush(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;

	if (data->frame_per_file && data->state == running) {
		if (data->cur_frame_in > data->min_frame_in &&
		    data->cur_frame_out > data->min_frame_out) {
			data->state = finishing;
		}
	}
	return (drive_compressor(f, data, 1, NULL, 0));
}